

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

Handle * __thiscall
leveldb::anon_unknown_0::LRUCache::Insert
          (LRUCache *this,Slice *key,uint32_t hash,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  size_t sVar1;
  char *__dest;
  char *__src;
  LRUHandle *pLVar2;
  bool bVar3;
  Slice SVar4;
  Slice local_78;
  undefined1 local_61;
  LRUHandle *pLStack_60;
  bool erased;
  LRUHandle *old;
  LRUHandle *local_48;
  LRUHandle *e;
  MutexLock l;
  _func_void_Slice_ptr_void_ptr *deleter_local;
  size_t charge_local;
  void *value_local;
  uint32_t hash_local;
  Slice *key_local;
  LRUCache *this_local;
  
  l.mu_ = (Mutex *)deleter;
  MutexLock::MutexLock((MutexLock *)&e,&this->mutex_);
  sVar1 = Slice::size(key);
  local_48 = (LRUHandle *)malloc(sVar1 + 0x47);
  local_48->value = value;
  local_48->deleter = (_func_void_Slice_ptr_void_ptr *)l.mu_;
  local_48->charge = charge;
  sVar1 = Slice::size(key);
  local_48->key_length = sVar1;
  local_48->hash = hash;
  local_48->in_cache = false;
  local_48->refs = 1;
  __dest = local_48->key_data;
  __src = Slice::data(key);
  sVar1 = Slice::size(key);
  memcpy(__dest,__src,sVar1);
  if (this->capacity_ == 0) {
    local_48->next = (LRUHandle *)0x0;
  }
  else {
    local_48->refs = local_48->refs + 1;
    local_48->in_cache = true;
    LRU_Append(this,&this->in_use_,local_48);
    this->usage_ = this->usage_ + charge;
    pLVar2 = HandleTable::Insert(&this->table_,local_48);
    FinishErase(this,pLVar2);
  }
  do {
    pLVar2 = local_48;
    bVar3 = false;
    if (this->capacity_ < this->usage_) {
      bVar3 = (this->lru_).next != &this->lru_;
    }
    if (!bVar3) {
      MutexLock::~MutexLock((MutexLock *)&e);
      return (Handle *)pLVar2;
    }
    pLStack_60 = (this->lru_).next;
    if (pLStack_60->refs != 1) {
      __assert_fail("old->refs == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                    ,0x127,
                    "Cache::Handle *leveldb::(anonymous namespace)::LRUCache::Insert(const Slice &, uint32_t, void *, size_t, void (*)(const Slice &, void *))"
                   );
    }
    SVar4 = LRUHandle::key(pLStack_60);
    local_78 = SVar4;
    pLVar2 = HandleTable::Remove(&this->table_,&local_78,pLStack_60->hash);
    local_61 = FinishErase(this,pLVar2);
  } while (((bool)local_61) || ((bool)local_61));
  __assert_fail("erased",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                ,0x12a,
                "Cache::Handle *leveldb::(anonymous namespace)::LRUCache::Insert(const Slice &, uint32_t, void *, size_t, void (*)(const Slice &, void *))"
               );
}

Assistant:

Cache::Handle* LRUCache::Insert(const Slice& key, uint32_t hash, void* value,
                                size_t charge,
                                void (*deleter)(const Slice& key,
                                                void* value)) {
  MutexLock l(&mutex_);

  LRUHandle* e =
      reinterpret_cast<LRUHandle*>(malloc(sizeof(LRUHandle) - 1 + key.size()));
  e->value = value;
  e->deleter = deleter;
  e->charge = charge;
  e->key_length = key.size();
  e->hash = hash;
  e->in_cache = false;
  e->refs = 1;  // for the returned handle.
  memcpy(e->key_data, key.data(), key.size());

  if (capacity_ > 0) {
    e->refs++;  // for the cache's reference.
    e->in_cache = true;
    LRU_Append(&in_use_, e);
    usage_ += charge;
    FinishErase(table_.Insert(e));
  } else {  // don't cache. (capacity_==0 is supported and turns off caching.)
    // next is read by key() in an assert, so it must be initialized
    e->next = nullptr;
  }
  while (usage_ > capacity_ && lru_.next != &lru_) {
    LRUHandle* old = lru_.next;
    assert(old->refs == 1);
    bool erased = FinishErase(table_.Remove(old->key(), old->hash));
    if (!erased) {  // to avoid unused variable when compiled NDEBUG
      assert(erased);
    }
  }

  return reinterpret_cast<Cache::Handle*>(e);
}